

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O3

void __thiscall
lzham::search_accelerator::find_all_matches_callback
          (search_accelerator *this,uint64 data,void *pData_ptr)

{
  long *plVar1;
  atomic32_t *paVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uchar *puVar6;
  CLZBase *pCVar7;
  node *pnVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  node *pnVar13;
  uint uVar14;
  uint *puVar15;
  long *plVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  long *plVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  long *plVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  bool bVar28;
  dict_match temp_matches [256];
  uint local_58c;
  node *local_588;
  node *local_570;
  uint local_550;
  uint local_538 [322];
  
  uVar26 = this->m_fill_lookahead_pos;
  uVar14 = this->m_fill_lookahead_size;
  if (uVar14 < 2) {
    iVar18 = 1;
    if (uVar14 == 0) goto LAB_0010fedd;
  }
  else {
    iVar18 = 2;
    if (uVar14 != 2) {
      local_58c = this->m_fill_dict_size;
      puVar6 = (this->m_dict).m_p;
      uVar11 = this->m_max_dict_size_mask & uVar26;
      bVar3 = puVar6[uVar11 + 1];
      uVar11 = (uint)puVar6[uVar11];
      do {
        uVar19 = (uint)bVar3;
        uVar22 = this->m_max_dict_size_mask & uVar26;
        bVar3 = puVar6[uVar22 + 2];
        uVar11 = (uint)bVar3 << 4 ^ (uVar19 << 8 | uVar11);
        if (((this->m_hash_thread_index).m_size == 0) ||
           (local_550 = (uint)data, (this->m_hash_thread_index).m_p[uVar11] == local_550)) {
          puVar15 = (this->m_hash).m_p;
          uVar21 = puVar15[uVar11];
          puVar15[uVar11] = uVar26;
          pCVar7 = this->m_pLZBase;
          pnVar8 = (this->m_nodes).m_p;
          local_588 = pnVar8 + uVar22;
          local_570 = (node *)&pnVar8[uVar22].m_right;
          uVar23 = 0x101;
          if (uVar14 < 0x101) {
            uVar23 = (ulong)uVar14;
          }
          plVar16 = (long *)(puVar6 + uVar22);
          uVar17 = this->m_max_probes;
          bVar4 = this->m_all_matches;
          uVar11 = 2;
          puVar15 = local_538;
          do {
            bVar28 = uVar17 == 0;
            uVar17 = uVar17 - 1;
            if (((bVar28) || (uVar26 == uVar21)) || (uVar27 = uVar26 - uVar21, local_58c <= uVar27))
            {
              local_588->m_left = 0;
              uVar17 = 0;
LAB_0010fdf3:
              local_570->m_left = uVar17;
              break;
            }
            uVar12 = this->m_max_dict_size_mask & uVar21;
            plVar1 = (long *)(puVar6 + uVar12);
            plVar20 = plVar16;
            for (plVar24 = plVar1;
                (plVar24 < (long *)((long)plVar1 + (uVar23 - 7)) && (*plVar24 == *plVar20));
                plVar24 = plVar24 + 1) {
              plVar20 = plVar20 + 1;
            }
            uVar25 = (long)plVar24 - (long)plVar1;
            bVar28 = true;
            if ((uint)uVar25 < (uint)uVar23) {
              uVar25 = uVar25 & 0xffffffff;
              do {
                if (*(char *)((long)plVar1 + uVar25) != *(char *)((long)plVar16 + uVar25)) {
                  bVar28 = false;
                  break;
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 < uVar23);
            }
            pnVar13 = pnVar8 + uVar12;
            uVar12 = (uint)uVar25;
            if (uVar11 < uVar12) {
              *(char *)(puVar15 + 1) = (char)uVar25 + -2;
              *puVar15 = uVar27;
              puVar15 = (uint *)((long)puVar15 + 5);
              uVar11 = uVar12;
              if (uVar12 == (uint)uVar23) {
                local_588->m_left = pnVar13->m_left;
                uVar17 = pnVar13->m_right;
                goto LAB_0010fdf3;
              }
            }
            else if ((bVar4 & 1U) == 0) {
              if (uVar11 < 3) {
                uVar11 = 2;
              }
              else if (uVar11 == uVar12) {
                uVar12 = *(uint *)((long)puVar15 + -5);
                if ((ulong)uVar12 < 0x1000) {
                  uVar9 = (uint)pCVar7->m_slot_tab0[uVar12];
                }
                else if (uVar12 < 0x100000) {
                  uVar9 = (uint)pCVar7->m_slot_tab1[uVar12 >> 0xb];
                }
                else if (uVar12 < 0x1000000) {
                  uVar9 = (uint)pCVar7->m_slot_tab2[uVar12 >> 0x10];
                }
                else if (uVar12 < 0x2000000) {
                  uVar9 = (uVar12 - 0x1000000 >> 0x17) + 0x30;
                }
                else if (uVar12 < 0x4000000) {
                  uVar9 = (uVar12 + 0xfe000000 >> 0x18) + 0x32;
                }
                else {
                  uVar9 = (uVar12 + 0xfc000000 >> 0x19) + 0x34;
                }
                if (uVar27 < 0x1000) {
                  uVar10 = (uint)pCVar7->m_slot_tab0[uVar27];
                }
                else {
                  if (uVar27 < 0x100000) {
                    bVar5 = pCVar7->m_slot_tab1[uVar27 >> 0xb];
                  }
                  else {
                    if (0xffffff < uVar27) {
                      if (uVar27 < 0x2000000) {
                        uVar10 = (uVar27 - 0x1000000 >> 0x17) + 0x30;
                      }
                      else if (uVar27 < 0x4000000) {
                        uVar10 = (uVar27 + 0xfe000000 >> 0x18) + 0x32;
                      }
                      else {
                        uVar10 = (uVar27 + 0xfc000000 >> 0x19) + 0x34;
                      }
                      goto LAB_0010fc46;
                    }
                    bVar5 = pCVar7->m_slot_tab2[uVar27 >> 0x10];
                  }
                  uVar10 = (uint)bVar5;
                }
LAB_0010fc46:
                if ((uVar10 < uVar9) ||
                   (((7 < uVar10 && (uVar10 == uVar9)) &&
                    ((uVar27 - (pCVar7->super_CLZDecompBase).m_lzx_position_base[uVar10] &
                      (pCVar7->super_CLZDecompBase).m_lzx_position_extra_mask[uVar10] & 0xf) <
                     ((pCVar7->super_CLZDecompBase).m_lzx_position_extra_mask[uVar9] &
                      uVar12 - (pCVar7->super_CLZDecompBase).m_lzx_position_base[uVar9] & 0xf))))) {
                  *(uint *)((long)puVar15 + -5) = uVar27;
                }
                else if ((!bVar28 && uVar10 <= uVar9) &&
                        (bVar5 = *(byte *)((long)plVar16 + (ulong)uVar11),
                        (byte)g_hamming_dist[bVar5 ^ *(byte *)((long)plVar1 + (ulong)uVar11)] <
                        (byte)g_hamming_dist
                              [puVar6[this->m_max_dict_size_mask & (uVar22 + uVar11) - uVar12] ^
                               bVar5])) {
                  *(uint *)((long)puVar15 + -5) = uVar27;
                }
              }
            }
            else {
              *(char *)(puVar15 + 1) = (char)uVar25 + -2;
              *puVar15 = uVar27;
              puVar15 = (uint *)((long)puVar15 + 5);
            }
            if (*(byte *)((long)plVar1 + (uVar25 & 0xffffffff)) <
                *(byte *)((long)plVar16 + (uVar25 & 0xffffffff))) {
              local_588->m_left = uVar21;
              pnVar13 = (node *)&pnVar13->m_right;
              local_588 = pnVar13;
            }
            else {
              local_570->m_left = uVar21;
              local_570 = pnVar13;
            }
            bVar28 = pnVar13->m_left != uVar21;
            uVar21 = pnVar13->m_left;
          } while (bVar28);
          uVar11 = ((int)puVar15 - (int)local_538) * -0x33333333;
          if (uVar11 == 0) {
            uVar23 = 0xfffffffffffffffe;
          }
          else {
            *(byte *)((long)puVar15 + -2) = *(byte *)((long)puVar15 + -2) | 0x80;
            uVar22 = this->m_max_matches;
            if (uVar11 <= this->m_max_matches) {
              uVar22 = uVar11;
            }
            LOCK();
            paVar2 = &this->m_next_match_ref;
            uVar23 = *paVar2;
            *paVar2 = *paVar2 + (ulong)uVar22;
            UNLOCK();
            uVar23 = uVar23 & 0xffffffff;
            memcpy((this->m_matches).m_p + uVar23,
                   (void *)((long)local_538 + (ulong)(uVar11 - uVar22) * 5),(ulong)uVar22 * 5);
          }
          LOCK();
          (this->m_match_refs).m_p[uVar26 - this->m_fill_lookahead_pos] = uVar23;
          UNLOCK();
        }
        iVar18 = 2;
        uVar26 = uVar26 + 1;
        local_58c = local_58c + 1;
        uVar14 = uVar14 - 1;
        uVar11 = uVar19;
      } while (2 < uVar14);
    }
  }
  do {
    pnVar8 = (this->m_nodes).m_p + (this->m_max_dict_size_mask & uVar26);
    pnVar8->m_left = 0;
    pnVar8->m_right = 0;
    LOCK();
    (this->m_match_refs).m_p[uVar26 - this->m_fill_lookahead_pos] = -2;
    UNLOCK();
    uVar26 = uVar26 + 1;
    iVar18 = iVar18 + -1;
  } while (iVar18 != 0);
LAB_0010fedd:
  LOCK();
  this->m_num_completed_helper_threads = this->m_num_completed_helper_threads + 1;
  UNLOCK();
  return;
}

Assistant:

void search_accelerator::find_all_matches_callback(uint64 data, void* pData_ptr)
   {
      scoped_perf_section find_all_matches_timer("find_all_matches_callback");

      pData_ptr;
      const uint thread_index = (uint)data;

      dict_match temp_matches[cMatchAccelMaxSupportedProbes * 2];

      uint fill_lookahead_pos = m_fill_lookahead_pos;
      uint fill_dict_size = m_fill_dict_size;
      uint fill_lookahead_size = m_fill_lookahead_size;

      uint c0 = 0, c1 = 0;
      if (fill_lookahead_size >= 2)
      {
         c0 = m_dict[fill_lookahead_pos & m_max_dict_size_mask];
         c1 = m_dict[(fill_lookahead_pos & m_max_dict_size_mask) + 1];
      }

      const uint8* pDict = m_dict.get_ptr();

      while (fill_lookahead_size >= 3)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;

         uint c2 = pDict[insert_pos + 2];
         uint h = hash3_to_16(c0, c1, c2);
         c0 = c1;
         c1 = c2;

         LZHAM_ASSERT(!m_hash_thread_index.size() || (m_hash_thread_index[h] != UINT8_MAX));

         // Only process those strings that this worker thread was assigned to - this allows us to manipulate multiple trees in parallel with no worries about synchronization.
         if (m_hash_thread_index.size() && (m_hash_thread_index[h] != thread_index))
         {
            fill_lookahead_pos++;
            fill_lookahead_size--;
            fill_dict_size++;
            continue;
         }

         dict_match* pDstMatch = temp_matches;

         uint cur_pos = m_hash[h];
         m_hash[h] = static_cast<uint>(fill_lookahead_pos);

         uint *pLeft = &m_nodes[insert_pos].m_left;
         uint *pRight = &m_nodes[insert_pos].m_right;

         const uint max_match_len = LZHAM_MIN(CLZBase::cMaxMatchLen, fill_lookahead_size);
         uint best_match_len = 2;

         const uint8* pIns = &pDict[insert_pos];

         uint n = m_max_probes;
         for ( ; ; )
         {
            uint delta_pos = fill_lookahead_pos - cur_pos;
            if ((n-- == 0) || (!delta_pos) || (delta_pos >= fill_dict_size))
            {
               *pLeft = 0;
               *pRight = 0;
               break;
            }

            uint pos = cur_pos & m_max_dict_size_mask;
            node *pNode = &m_nodes[pos];

            // Unfortunately, the initial compare match_len must be 2 because of the way we truncate matches at the end of each block.
            uint match_len = 0;
            const uint8* pComp = &pDict[pos];

#if LZHAM_PLATFORM_X360
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
#else
            // Compare a qword at a time for a bit more efficiency.
            const uint64* pComp_end = reinterpret_cast<const uint64*>(pComp + max_match_len - 7);
            const uint64* pComp_cur = reinterpret_cast<const uint64*>(pComp);
            const uint64* pIns_cur = reinterpret_cast<const uint64*>(pIns);
            while (pComp_cur < pComp_end)
            {
               if (*pComp_cur != *pIns_cur)
                  break;
               pComp_cur++;
               pIns_cur++;
            }
            uint alt_match_len = static_cast<uint>(reinterpret_cast<const uint8*>(pComp_cur) - reinterpret_cast<const uint8*>(pComp));
            for ( ; alt_match_len < max_match_len; alt_match_len++)
               if (pComp[alt_match_len] != pIns[alt_match_len])
                  break;
#ifdef LZVERIFY
            for ( ; match_len < max_match_len; match_len++)
               if (pComp[match_len] != pIns[match_len])
                  break;
            LZHAM_VERIFY(alt_match_len == match_len);
#endif
            match_len = alt_match_len;
#endif

            if (match_len > best_match_len)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;

               best_match_len = match_len;

               if (match_len == max_match_len)
               {
                  *pLeft = pNode->m_left;
                  *pRight = pNode->m_right;
                  break;
               }
            }
            else if (m_all_matches)
            {
               pDstMatch->m_len = static_cast<uint8>(match_len - CLZBase::cMinMatchLen);
               pDstMatch->m_dist = delta_pos;
               pDstMatch++;
            }
            else if ((best_match_len > 2) && (best_match_len == match_len))
            {
               uint bestMatchDist = pDstMatch[-1].m_dist;
               uint compMatchDist = delta_pos;

               uint bestMatchSlot, bestMatchSlotOfs;
               m_pLZBase->compute_lzx_position_slot(bestMatchDist, bestMatchSlot, bestMatchSlotOfs);

               uint compMatchSlot, compMatchOfs;
               m_pLZBase->compute_lzx_position_slot(compMatchDist, compMatchSlot, compMatchOfs);

               // If both matches uses the same match slot, choose the one with the offset containing the lowest nibble as these bits separately entropy coded.
               // This could choose a match which is further away in the absolute sense, but closer in a coding sense.
               if ( (compMatchSlot < bestMatchSlot) ||
                  ((compMatchSlot >= 8) && (compMatchSlot == bestMatchSlot) && ((compMatchOfs & 15) < (bestMatchSlotOfs & 15))) )
               {
                  LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                  pDstMatch[-1].m_dist = delta_pos;
               }
               else if ((match_len < max_match_len) && (compMatchSlot <= bestMatchSlot))
               {
                  // Choose the match which has lowest hamming distance in the mismatch byte for a tiny win on binary files.
                  // TODO: This competes against the prev. optimization.
                  uint desired_mismatch_byte = pIns[match_len];

                  uint cur_mismatch_byte = pDict[(insert_pos - bestMatchDist + match_len) & m_max_dict_size_mask];
                  uint cur_mismatch_dist = g_hamming_dist[cur_mismatch_byte ^ desired_mismatch_byte];

                  uint new_mismatch_byte = pComp[match_len];
                  uint new_mismatch_dist = g_hamming_dist[new_mismatch_byte ^ desired_mismatch_byte];
                  if (new_mismatch_dist < cur_mismatch_dist)
                  {
                     LZHAM_ASSERT((pDstMatch[-1].m_len + (uint)CLZBase::cMinMatchLen) == best_match_len);
                     pDstMatch[-1].m_dist = delta_pos;
                  }
               }
            }

            uint new_pos;
            if (pComp[match_len] < pIns[match_len])
            {
               *pLeft = cur_pos;
               pLeft = &pNode->m_right;
               new_pos = pNode->m_right;
            }
            else
            {
               *pRight = cur_pos;
               pRight = &pNode->m_left;
               new_pos = pNode->m_left;
            }
            if (new_pos == cur_pos)
               break;
            cur_pos = new_pos;
         }

         const uint num_matches = (uint)(pDstMatch - temp_matches);

         if (num_matches)
         {
            pDstMatch[-1].m_dist |= 0x80000000;

            const uint num_matches_to_write = LZHAM_MIN(num_matches, m_max_matches);

            const uint match_ref_ofs = atomic_exchange_add(&m_next_match_ref, num_matches_to_write);

            memcpy(&m_matches[match_ref_ofs],
                   temp_matches + (num_matches - num_matches_to_write),
                   sizeof(temp_matches[0]) * num_matches_to_write);

            // FIXME: This is going to really hurt on platforms requiring export barriers.
            LZHAM_MEMORY_EXPORT_BARRIER

            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], match_ref_ofs);
         }
         else
         {
            atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);
         }

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }

      while (fill_lookahead_size)
      {
         uint insert_pos = fill_lookahead_pos & m_max_dict_size_mask;
         m_nodes[insert_pos].m_left = 0;
         m_nodes[insert_pos].m_right = 0;

         atomic_exchange32((atomic32_t*)&m_match_refs[static_cast<uint>(fill_lookahead_pos - m_fill_lookahead_pos)], -2);

         fill_lookahead_pos++;
         fill_lookahead_size--;
         fill_dict_size++;
      }
      
      atomic_increment32(&m_num_completed_helper_threads);
   }